

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

ssize_t nghttp2_bufs_remove(nghttp2_bufs *bufs,uint8_t **out)

{
  uint8_t *src;
  nghttp2_buf_chain *pnVar1;
  uint8_t *puVar2;
  uint8_t *dest;
  uint8_t *size;
  
  pnVar1 = bufs->head;
  if (pnVar1 != (nghttp2_buf_chain *)0x0) {
    size = (uint8_t *)0x0;
    do {
      size = (pnVar1->buf).last + ((long)size - (long)(pnVar1->buf).pos);
      pnVar1 = pnVar1->next;
    } while (pnVar1 != (nghttp2_buf_chain *)0x0);
    if (size != (uint8_t *)0x0) {
      puVar2 = (uint8_t *)nghttp2_mem_malloc(bufs->mem,(size_t)size);
      if (puVar2 != (uint8_t *)0x0) {
        dest = puVar2;
        for (pnVar1 = bufs->head; pnVar1 != (nghttp2_buf_chain *)0x0; pnVar1 = pnVar1->next) {
          src = (pnVar1->buf).pos;
          dest = nghttp2_cpymem(dest,src,(long)(pnVar1->buf).last - (long)src);
        }
        *out = puVar2;
        return (ssize_t)size;
      }
      return -0x385;
    }
  }
  return 0;
}

Assistant:

ssize_t nghttp2_bufs_remove(nghttp2_bufs *bufs, uint8_t **out) {
  size_t len;
  nghttp2_buf_chain *chain;
  nghttp2_buf *buf;
  uint8_t *res;
  nghttp2_buf resbuf;

  len = 0;

  for (chain = bufs->head; chain; chain = chain->next) {
    len += nghttp2_buf_len(&chain->buf);
  }

  if (len == 0) {
    res = NULL;
    return 0;
  }

  res = nghttp2_mem_malloc(bufs->mem, len);
  if (res == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_buf_wrap_init(&resbuf, res, len);

  for (chain = bufs->head; chain; chain = chain->next) {
    buf = &chain->buf;
    resbuf.last = nghttp2_cpymem(resbuf.last, buf->pos, nghttp2_buf_len(buf));
  }

  *out = res;

  return (ssize_t)len;
}